

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

bool __thiscall llvm::DWARFUnit::parseDWO(DWARFUnit *this)

{
  AlignedCharArrayUnion<char> *__return_storage_ptr__;
  DWARFSection **this_00;
  DWARFContext *pDVar1;
  uint64_t Offset;
  DWARFSection *RS;
  bool bVar2;
  bool bVar3;
  DwarfFormat Format;
  byte bVar4;
  uint16_t uVar5;
  int iVar6;
  element_type *peVar7;
  char **ppcVar8;
  element_type *this_01;
  unsigned_long *puVar9;
  DWARFCompileUnit *__p;
  element_type *peVar10;
  DWARFObject *pDVar11;
  undefined4 extraout_var;
  reference y;
  raw_ostream *prVar12;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_02;
  Error *E;
  Optional<const_char_*> OVar13;
  Optional<unsigned_long> OVar14;
  StringRef SVar15;
  uint64_t local_448;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_310;
  Optional<unsigned_long> DWORangesBase;
  string local_2f8;
  undefined1 local_2d8 [8];
  Expected<llvm::DWARFDebugRnglistTable> TableOrError;
  DWARFDataExtractor RangesDA;
  DWARFCompileUnit *DWOCU;
  undefined1 local_1e8 [8];
  shared_ptr<llvm::DWARFContext> DWOContext;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_1d0;
  Optional<unsigned_long> DWOId;
  Twine local_1a8;
  Twine local_190;
  Twine local_178;
  Twine local_160;
  Twine local_148;
  Twine local_130;
  Twine local_118;
  Twine local_f0;
  undefined1 local_d8 [8];
  SmallString<16U> AbsolutePath;
  undefined1 local_80 [8];
  Optional<const_char_*> CompilationDir;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 local_38;
  Optional<const_char_*> DWOFileName;
  DWARFDie UnitDie;
  DWARFUnit *this_local;
  
  if ((this->IsDWO & 1U) == 0) {
    peVar7 = std::__shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>
                       );
    if (peVar7 == (element_type *)0x0) {
      join_0x00000010_0x00000000_ = getUnitDIE(this,true);
      bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)&DWOFileName.Storage.hasVal);
      if (bVar2) {
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)&CompilationDir.Storage.hasVal,
                       (DWARFDie *)&DWOFileName.Storage.hasVal,DW_AT_GNU_dwo_name);
        OVar13 = dwarf::toString((Optional<llvm::DWARFFormValue> *)&CompilationDir.Storage.hasVal);
        local_38 = OVar13.Storage.field_0;
        DWOFileName.Storage.field_0.empty = OVar13.Storage.hasVal;
        bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_38.empty);
        if (bVar2) {
          __return_storage_ptr__ =
               AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
               InlineElts + 8;
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)__return_storage_ptr__,
                         (DWARFDie *)&DWOFileName.Storage.hasVal,DW_AT_comp_dir);
          OVar13 = dwarf::toString((Optional<llvm::DWARFFormValue> *)__return_storage_ptr__);
          local_80 = (undefined1  [8])OVar13.Storage.field_0;
          CompilationDir.Storage.field_0.empty = OVar13.Storage.hasVal;
          SmallString<16U>::SmallString((SmallString<16U> *)local_d8);
          ppcVar8 = Optional<const_char_*>::operator*((Optional<const_char_*> *)&local_38);
          Twine::Twine(&local_f0,*ppcVar8);
          bVar3 = sys::path::is_relative(&local_f0,native);
          bVar2 = false;
          if (bVar3) {
            bVar3 = llvm::Optional::operator_cast_to_bool((Optional *)local_80);
            bVar2 = false;
            if (bVar3) {
              ppcVar8 = Optional<const_char_*>::operator*((Optional<const_char_*> *)local_80);
              bVar2 = *ppcVar8 != (char *)0x0;
            }
          }
          if (bVar2) {
            ppcVar8 = Optional<const_char_*>::operator*((Optional<const_char_*> *)local_80);
            Twine::Twine(&local_118,*ppcVar8);
            Twine::Twine(&local_130,"");
            Twine::Twine(&local_148,"");
            Twine::Twine(&local_160,"");
            sys::path::append((SmallVectorImpl<char> *)local_d8,&local_118,&local_130,&local_148,
                              &local_160);
          }
          ppcVar8 = Optional<const_char_*>::operator*((Optional<const_char_*> *)&local_38);
          Twine::Twine(&local_178,*ppcVar8);
          Twine::Twine(&local_190,"");
          Twine::Twine(&local_1a8,"");
          Twine::Twine((Twine *)&DWOId.Storage.hasVal,"");
          sys::path::append((SmallVectorImpl<char> *)local_d8,&local_178,&local_190,&local_1a8,
                            (Twine *)&DWOId.Storage.hasVal);
          OVar14 = getDWOId(this);
          local_1d0 = OVar14.Storage.field_0;
          DWOId.Storage.field_0.empty = OVar14.Storage.hasVal;
          bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_1d0.empty);
          if (bVar2) {
            pDVar1 = this->Context;
            SVar15 = SmallString::operator_cast_to_StringRef((SmallString *)local_d8);
            SVar15.Length = (size_t)SVar15.Data;
            SVar15.Data = (char *)pDVar1;
            DWARFContext::getDWOContext((DWARFContext *)local_1e8,SVar15);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1e8);
            if (bVar2) {
              this_01 = std::
                        __shared_ptr_access<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1e8);
              puVar9 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_1d0);
              __p = DWARFContext::getDWOCompileUnitForHash(this_01,*puVar9);
              if (__p == (DWARFCompileUnit *)0x0) {
                this_local._7_1_ = false;
              }
              else {
                this_00 = &RangesDA.Section;
                std::shared_ptr<llvm::DWARFCompileUnit>::shared_ptr<llvm::DWARFContext>
                          ((shared_ptr<llvm::DWARFCompileUnit> *)this_00,
                           (shared_ptr<llvm::DWARFContext> *)local_1e8,__p);
                std::shared_ptr<llvm::DWARFUnit>::operator=
                          (&this->DWO,(shared_ptr<llvm::DWARFCompileUnit> *)this_00);
                std::shared_ptr<llvm::DWARFCompileUnit>::~shared_ptr
                          ((shared_ptr<llvm::DWARFCompileUnit> *)this_00);
                peVar10 = std::
                          __shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&this->DWO);
                setAddrOffsetSection(peVar10,this->AddrOffsetSection,this->AddrOffsetSectionBase);
                uVar5 = getVersion(this);
                if (uVar5 < 5) {
                  OVar14 = DWARFDie::getRangesBaseAttribute((DWARFDie *)&DWOFileName.Storage.hasVal)
                  ;
                  local_310 = OVar14.Storage.field_0;
                  DWORangesBase.Storage.field_0.empty = OVar14.Storage.hasVal;
                  peVar10 = std::
                            __shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&this->DWO);
                  RS = this->RangeSection;
                  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_310.empty);
                  if (bVar2) {
                    puVar9 = Optional<unsigned_long>::operator*
                                       ((Optional<unsigned_long> *)&local_310);
                    local_448 = *puVar9;
                  }
                  else {
                    local_448 = 0;
                  }
                  setRangesSection(peVar10,RS,local_448);
                }
                else {
                  peVar10 = std::
                            __shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&this->DWO);
                  pDVar11 = DWARFContext::getDWARFObj(this->Context);
                  iVar6 = (*pDVar11->_vptr_DWARFObject[0x22])();
                  setRangesSection(peVar10,(DWARFSection *)CONCAT44(extraout_var,iVar6),0);
                  pDVar11 = DWARFContext::getDWARFObj(this->Context);
                  DWARFDataExtractor::DWARFDataExtractor
                            ((DWARFDataExtractor *)&TableOrError.field_0x98,pDVar11,
                             this->RangeSection,(bool)(this->isLittleEndian & 1),'\0');
                  Offset = this->RangeSectionBase;
                  Format = DWARFUnitHeader::getFormat(&this->Header);
                  parseRngListTableHeader
                            ((Expected<llvm::DWARFDebugRnglistTable> *)local_2d8,
                             (DWARFDataExtractor *)&TableOrError.field_0x98,Offset,Format);
                  bVar2 = llvm::Expected::operator_cast_to_bool((Expected *)local_2d8);
                  if (bVar2) {
                    y = Expected<llvm::DWARFDebugRnglistTable>::get
                                  ((Expected<llvm::DWARFDebugRnglistTable> *)local_2d8);
                    peVar10 = std::
                              __shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&this->DWO);
                    Optional<llvm::DWARFDebugRnglistTable>::operator=(&peVar10->RngListTable,y);
                  }
                  else {
                    prVar12 = WithColor::error();
                    prVar12 = raw_ostream::operator<<(prVar12,"parsing a range list table: ");
                    Expected<llvm::DWARFDebugRnglistTable>::takeError
                              ((Expected<llvm::DWARFDebugRnglistTable> *)
                               &DWORangesBase.Storage.hasVal);
                    toString_abi_cxx11_(&local_2f8,(llvm *)&DWORangesBase.Storage.hasVal,E);
                    prVar12 = raw_ostream::operator<<(prVar12,&local_2f8);
                    raw_ostream::operator<<(prVar12,'\n');
                    std::__cxx11::string::~string((string *)&local_2f8);
                    Error::~Error((Error *)&DWORangesBase.Storage.hasVal);
                  }
                  Expected<llvm::DWARFDebugRnglistTable>::~Expected
                            ((Expected<llvm::DWARFDebugRnglistTable> *)local_2d8);
                  peVar10 = std::
                            __shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&this->DWO);
                  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&peVar10->RngListTable);
                  if (bVar2) {
                    peVar10 = std::
                              __shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&this->DWO);
                    this_02 = &Optional<llvm::DWARFDebugRnglistTable>::operator->
                                         (&peVar10->RngListTable)->
                               super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
                    bVar4 = DWARFListTableBase<llvm::DWARFDebugRnglist>::getHeaderSize(this_02);
                    peVar10 = std::
                              __shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&this->DWO);
                    peVar10->RangeSectionBase = (ulong)bVar4;
                  }
                }
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = false;
            }
            DWOContext.super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
            std::shared_ptr<llvm::DWARFContext>::~shared_ptr
                      ((shared_ptr<llvm::DWARFContext> *)local_1e8);
          }
          else {
            this_local._7_1_ = false;
            DWOContext.super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 1;
          }
          SmallString<16U>::~SmallString((SmallString<16U> *)local_d8);
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFUnit::parseDWO() {
  if (IsDWO)
    return false;
  if (DWO.get())
    return false;
  DWARFDie UnitDie = getUnitDIE();
  if (!UnitDie)
    return false;
  auto DWOFileName = dwarf::toString(UnitDie.find(DW_AT_GNU_dwo_name));
  if (!DWOFileName)
    return false;
  auto CompilationDir = dwarf::toString(UnitDie.find(DW_AT_comp_dir));
  SmallString<16> AbsolutePath;
  if (sys::path::is_relative(*DWOFileName) && CompilationDir &&
      *CompilationDir) {
    sys::path::append(AbsolutePath, *CompilationDir);
  }
  sys::path::append(AbsolutePath, *DWOFileName);
  auto DWOId = getDWOId();
  if (!DWOId)
    return false;
  auto DWOContext = Context.getDWOContext(AbsolutePath);
  if (!DWOContext)
    return false;

  DWARFCompileUnit *DWOCU = DWOContext->getDWOCompileUnitForHash(*DWOId);
  if (!DWOCU)
    return false;
  DWO = std::shared_ptr<DWARFCompileUnit>(std::move(DWOContext), DWOCU);
  // Share .debug_addr and .debug_ranges section with compile unit in .dwo
  DWO->setAddrOffsetSection(AddrOffsetSection, AddrOffsetSectionBase);
  if (getVersion() >= 5) {
    DWO->setRangesSection(&Context.getDWARFObj().getRnglistsDWOSection(), 0);
    DWARFDataExtractor RangesDA(Context.getDWARFObj(), *RangeSection,
                                isLittleEndian, 0);
    if (auto TableOrError = parseRngListTableHeader(RangesDA, RangeSectionBase,
                                                    Header.getFormat()))
      DWO->RngListTable = TableOrError.get();
    else
      WithColor::error() << "parsing a range list table: "
                         << toString(TableOrError.takeError())
                         << '\n';
    if (DWO->RngListTable)
      DWO->RangeSectionBase = DWO->RngListTable->getHeaderSize();
  } else {
    auto DWORangesBase = UnitDie.getRangesBaseAttribute();
    DWO->setRangesSection(RangeSection, DWORangesBase ? *DWORangesBase : 0);
  }

  return true;
}